

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_create_table.cpp
# Opt level: O3

void duckdb::CheckForeignKeyTypes
               (ColumnList *pk_columns,ColumnList *fk_columns,ForeignKeyConstraint *fk)

{
  pointer pcVar1;
  bool bVar2;
  reference pvVar3;
  ColumnDefinition *this;
  ColumnDefinition *this_00;
  LogicalType *pLVar4;
  LogicalType *rhs;
  BinderException *this_01;
  string *psVar5;
  size_type __n;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  
  if ((fk->info).pk_keys.super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>
      .super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (fk->info).pk_keys.super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>
      .super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>._M_impl.
      super__Vector_impl_data._M_start) {
    __n = 0;
    do {
      pvVar3 = vector<duckdb::PhysicalIndex,_true>::operator[](&(fk->info).pk_keys,__n);
      this = ColumnList::GetColumn(pk_columns,(PhysicalIndex)pvVar3->index);
      pvVar3 = vector<duckdb::PhysicalIndex,_true>::operator[](&(fk->info).fk_keys,__n);
      this_00 = ColumnList::GetColumn(fk_columns,(PhysicalIndex)pvVar3->index);
      pLVar4 = ColumnDefinition::Type(this);
      rhs = ColumnDefinition::Type(this_00);
      bVar2 = LogicalType::operator==(pLVar4,rhs);
      if (!bVar2) {
        this_01 = (BinderException *)__cxa_allocate_exception(0x10);
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_d0,
                   "Failed to create foreign key: incompatible types between column \"%s\" (\"%s\") and column \"%s\" (\"%s\")"
                   ,"");
        psVar5 = ColumnDefinition::Name_abi_cxx11_(this);
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        pcVar1 = (psVar5->_M_dataplus)._M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_90,pcVar1,pcVar1 + psVar5->_M_string_length);
        pLVar4 = ColumnDefinition::Type(this);
        LogicalType::ToString_abi_cxx11_(&local_50,pLVar4);
        psVar5 = ColumnDefinition::Name_abi_cxx11_(this_00);
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        pcVar1 = (psVar5->_M_dataplus)._M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_b0,pcVar1,pcVar1 + psVar5->_M_string_length);
        pLVar4 = ColumnDefinition::Type(this_00);
        LogicalType::ToString_abi_cxx11_(&local_70,pLVar4);
        BinderException::
        BinderException<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                  (this_01,&local_d0,&local_90,&local_50,&local_b0,&local_70);
        __cxa_throw(this_01,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
      __n = __n + 1;
    } while (__n < (ulong)((long)(fk->info).pk_keys.
                                 super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>
                                 .
                                 super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(fk->info).pk_keys.
                                 super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>
                                 .
                                 super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  return;
}

Assistant:

static void CheckForeignKeyTypes(const ColumnList &pk_columns, const ColumnList &fk_columns, ForeignKeyConstraint &fk) {
	D_ASSERT(fk.info.pk_keys.size() == fk.info.fk_keys.size());
	for (idx_t c_idx = 0; c_idx < fk.info.pk_keys.size(); c_idx++) {
		auto &pk_col = pk_columns.GetColumn(fk.info.pk_keys[c_idx]);
		auto &fk_col = fk_columns.GetColumn(fk.info.fk_keys[c_idx]);
		if (pk_col.Type() != fk_col.Type()) {
			throw BinderException("Failed to create foreign key: incompatible types between column \"%s\" (\"%s\") and "
			                      "column \"%s\" (\"%s\")",
			                      pk_col.Name(), pk_col.Type().ToString(), fk_col.Name(), fk_col.Type().ToString());
		}
	}
}